

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  U32 length;
  uint uVar8;
  int iVar9;
  ushort *puVar10;
  ushort *puVar11;
  byte *pbVar12;
  byte *pbVar13;
  BYTE *d_1;
  byte *pbVar14;
  BYTE *d;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  long lVar18;
  BYTE *s;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  BYTE *e;
  ulong uVar22;
  byte *local_38;
  
  if (source == (char *)0x0) {
    source = (char *)0xffffffff;
    goto LAB_00115991;
  }
  lVar18 = dictSize + (long)dictStart;
  if (dictStart == (void *)0x0) {
    lVar18 = 0;
  }
  if (originalSize == 0) {
    source = (char *)(ulong)(-(uint)(*source != '\0') | 1);
    goto LAB_00115991;
  }
  pbVar1 = (byte *)(dest + originalSize);
  iVar4 = (int)source;
  pbVar15 = (byte *)dest;
  if (originalSize < 0x40) goto LAB_00115940;
LAB_00115420:
  while( true ) {
    bVar3 = (byte)*(ushort *)source;
    uVar20 = (uint)bVar3;
    uVar8 = (uint)(bVar3 >> 4);
    if (uVar8 == 0xf) {
      uVar8 = 0;
      puVar11 = (ushort *)((long)source + 0x10);
      do {
        puVar10 = puVar11;
        uVar8 = uVar8 + *(byte *)((long)puVar10 + -0xf);
        puVar11 = (ushort *)((long)puVar10 + 1);
      } while (*(byte *)((long)puVar10 + -0xf) == 0xff);
      uVar19 = (ulong)uVar8;
      pbVar14 = pbVar15 + uVar19 + 0xf;
      source = (char *)(puVar10 + -7);
      iVar9 = 6;
      if (pbVar14 <= dest + (long)originalSize + -8) {
        do {
          *(undefined8 *)pbVar15 = *(undefined8 *)source;
          pbVar15 = pbVar15 + 8;
          source = (char *)((long)source + 8);
        } while (pbVar15 < pbVar14);
        source = (char *)((long)puVar10 + 1 + uVar19);
        iVar9 = 0;
        pbVar15 = pbVar14;
      }
      if (iVar9 != 0) {
        if (iVar9 == 6) {
          uVar19 = uVar19 + 0xf;
          goto LAB_001157ee;
        }
        goto LAB_00115991;
      }
    }
    else {
      *(undefined8 *)pbVar15 = *(undefined8 *)((long)source + 1);
      if (0x8f < bVar3) {
        *(undefined8 *)(pbVar15 + 8) = *(undefined8 *)((long)source + 9);
      }
      source = (char *)((byte *)((long)source + 1) + uVar8);
      pbVar15 = pbVar15 + uVar8;
    }
    pbVar14 = pbVar15;
    uVar7 = *(ushort *)source;
    uVar19 = (ulong)uVar7;
    uVar20 = (uint)uVar7;
    source = (char *)((long)source + 2);
    pbVar16 = pbVar14 + -uVar19;
    uVar22 = (ulong)(bVar3 & 0xf);
    if (uVar22 == 0xf) break;
    uVar21 = uVar22 + 4;
    if (pbVar1 + -0x40 <= pbVar14 + uVar22 + 4) goto LAB_0011584c;
    if ((pbVar16 < dest) || (uVar7 < 8)) goto LAB_00115501;
    *(undefined8 *)pbVar14 = *(undefined8 *)pbVar16;
    *(undefined8 *)(pbVar14 + 8) = *(undefined8 *)(pbVar16 + 8);
    *(undefined2 *)(pbVar14 + 0x10) = *(undefined2 *)(pbVar16 + 0x10);
    pbVar15 = pbVar14 + uVar22 + 4;
  }
  uVar8 = 0;
  do {
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar8 = uVar8 + (byte)uVar6;
  } while ((byte)uVar6 == 0xff);
  uVar21 = (ulong)uVar8 + 0x13;
  if (pbVar1 + -0x40 <= pbVar14 + (ulong)uVar8 + 0x13) goto LAB_0011584c;
LAB_00115501:
  pbVar2 = pbVar14 + uVar21;
  pbVar15 = pbVar2;
  if (dest <= pbVar16) {
    if (0xf < uVar7) {
      do {
        uVar5 = *(undefined8 *)(pbVar14 + -uVar19 + 8);
        *(undefined8 *)pbVar14 = *(undefined8 *)(pbVar14 + -uVar19);
        *(undefined8 *)(pbVar14 + 8) = uVar5;
        uVar5 = *(undefined8 *)(pbVar14 + -uVar19 + 0x10 + 8);
        *(undefined8 *)(pbVar14 + 0x10) = *(undefined8 *)(pbVar14 + -uVar19 + 0x10);
        *(undefined8 *)(pbVar14 + 0x18) = uVar5;
        pbVar14 = pbVar14 + 0x20;
      } while (pbVar14 < pbVar2);
      goto LAB_00115420;
    }
    if (uVar19 == 4) {
      iVar9 = *(int *)pbVar16;
    }
    else if (uVar7 == 2) {
      iVar9 = CONCAT22(*(undefined2 *)pbVar16,*(undefined2 *)pbVar16);
    }
    else {
      if (uVar7 != 1) {
        if (uVar7 < 8) {
          pbVar14[0] = 0;
          pbVar14[1] = 0;
          pbVar14[2] = 0;
          pbVar14[3] = 0;
          *pbVar14 = *pbVar16;
          pbVar14[1] = pbVar16[1];
          pbVar14[2] = pbVar16[2];
          pbVar14[3] = pbVar16[3];
          uVar20 = inc32table[uVar7];
          *(undefined4 *)(pbVar14 + 4) = *(undefined4 *)(pbVar16 + uVar20);
          pbVar16 = pbVar16 + ((ulong)uVar20 - (long)dec64table[uVar7]);
        }
        else {
          *(undefined8 *)pbVar14 = *(undefined8 *)pbVar16;
          pbVar16 = pbVar16 + 8;
        }
        pbVar14 = pbVar14 + 8;
        do {
          *(undefined8 *)pbVar14 = *(undefined8 *)pbVar16;
          pbVar14 = pbVar14 + 8;
          pbVar16 = pbVar16 + 8;
        } while (pbVar14 < pbVar2);
        goto LAB_00115420;
      }
      iVar9 = (uint)*pbVar16 * 0x1010101;
    }
    *(int *)pbVar14 = iVar9;
    *(int *)(pbVar14 + 4) = iVar9;
    if (8 < uVar21) {
      pbVar14 = pbVar14 + 8;
      do {
        *(int *)pbVar14 = iVar9;
        *(int *)(pbVar14 + 4) = iVar9;
        pbVar14 = pbVar14 + 8;
      } while (pbVar14 < pbVar2);
    }
    goto LAB_00115420;
  }
  if (pbVar2 <= pbVar1 + -5) {
    uVar22 = (long)dest - (long)pbVar16;
    uVar19 = uVar21 - uVar22;
    if (uVar21 < uVar22 || uVar19 == 0) {
      memmove(pbVar14,(void *)(lVar18 - uVar22),uVar21);
    }
    else {
      memcpy(pbVar14,(void *)(lVar18 - uVar22),uVar22);
      pbVar15 = pbVar14 + uVar22;
      if ((ulong)((long)pbVar15 - (long)dest) < uVar19) {
        pbVar14 = (byte *)dest;
        if ((long)uVar22 < (long)uVar21) {
          do {
            *pbVar15 = *pbVar14;
            pbVar15 = pbVar15 + 1;
            pbVar14 = pbVar14 + 1;
          } while (pbVar15 < pbVar2);
        }
      }
      else {
        memcpy(pbVar15,dest,uVar19);
        pbVar15 = pbVar2;
      }
    }
    goto LAB_00115420;
  }
  goto LAB_00115737;
LAB_0011584c:
  pbVar2 = pbVar14 + uVar21;
  pbVar15 = pbVar2;
  if (pbVar16 < dest) {
    if (pbVar1 + -5 < pbVar2) goto LAB_00115737;
    uVar19 = (long)dest - (long)pbVar16;
    uVar22 = uVar21 - uVar19;
    if (uVar21 < uVar19 || uVar22 == 0) {
      memmove(pbVar14,(void *)(lVar18 - uVar19),uVar21);
    }
    else {
      memcpy(pbVar14,(void *)(lVar18 - uVar19),uVar19);
      pbVar15 = pbVar14 + uVar19;
      if ((ulong)((long)pbVar15 - (long)dest) < uVar22) {
        pbVar14 = (byte *)dest;
        if ((long)uVar19 < (long)uVar21) {
          do {
            *pbVar15 = *pbVar14;
            pbVar15 = pbVar15 + 1;
            pbVar14 = pbVar14 + 1;
          } while (pbVar15 < pbVar2);
        }
      }
      else {
        memcpy(pbVar15,dest,uVar22);
        pbVar15 = pbVar2;
      }
    }
  }
  else {
    if (uVar20 < 8) {
      LZ4_decompress_fast_extDict_cold_1();
      pbVar16 = local_38;
    }
    else {
      *(undefined8 *)pbVar14 = *(undefined8 *)pbVar16;
      pbVar16 = pbVar16 + 8;
    }
    pbVar13 = pbVar14 + 8;
    if (pbVar1 + -0xc < pbVar2) {
      iVar9 = 5;
      if (pbVar2 <= pbVar1 + -5) {
        pbVar12 = pbVar1 + -7;
        pbVar14 = pbVar16;
        pbVar17 = pbVar13;
        if (pbVar13 < pbVar12) {
          do {
            *(undefined8 *)pbVar17 = *(undefined8 *)pbVar14;
            pbVar17 = pbVar17 + 8;
            pbVar14 = pbVar14 + 8;
          } while (pbVar17 < pbVar12);
          pbVar16 = pbVar16 + ((long)pbVar12 - (long)pbVar13);
          pbVar13 = pbVar12;
        }
        iVar9 = 0;
        for (; pbVar13 < pbVar2; pbVar13 = pbVar13 + 1) {
          bVar3 = *pbVar16;
          pbVar16 = pbVar16 + 1;
          *pbVar13 = bVar3;
        }
      }
      if (iVar9 != 0) {
        if (iVar9 == 5) goto LAB_00115737;
        goto LAB_00115991;
      }
    }
    else {
      *(undefined8 *)pbVar13 = *(undefined8 *)pbVar16;
      if (0x10 < uVar21) {
        pbVar14 = pbVar14 + 0x10;
        do {
          pbVar16 = pbVar16 + 8;
          *(undefined8 *)pbVar14 = *(undefined8 *)pbVar16;
          pbVar14 = pbVar14 + 8;
        } while (pbVar14 < pbVar2);
      }
    }
  }
LAB_00115940:
  bVar3 = (byte)*(ushort *)source;
  source = (char *)((long)source + 1);
  while( true ) {
    uVar20 = (uint)bVar3;
    uVar19 = (ulong)(bVar3 >> 4);
    if ((0x8f < uVar20) || (dest + (long)originalSize + -0x1a < pbVar15)) break;
    *(undefined8 *)pbVar15 = *(undefined8 *)source;
    pbVar14 = pbVar15 + uVar19;
    uVar21 = (ulong)(uVar20 & 0xf);
    puVar11 = (ushort *)((long)source + uVar19);
    uVar22 = (ulong)*puVar11;
    pbVar16 = pbVar14 + -uVar22;
    if (((uVar20 & 0xf) == 0xf) || ((*puVar11 < 8 || (pbVar16 < dest)))) goto LAB_00115826;
    *(undefined8 *)pbVar14 = *(undefined8 *)pbVar16;
    *(undefined8 *)(pbVar14 + 8) = *(undefined8 *)(pbVar16 + 8);
    *(undefined2 *)(pbVar14 + 0x10) = *(undefined2 *)(pbVar16 + 0x10);
    pbVar15 = pbVar14 + uVar21 + 4;
    bVar3 = *(byte *)((long)source + uVar19 + 2);
    source = (char *)((long)source + uVar19 + 3);
  }
  if (bVar3 >> 4 == 0xf) {
    uVar8 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    uVar19 = (ulong)uVar8 + 0xf;
  }
  pbVar14 = pbVar15 + uVar19;
LAB_001157ee:
  puVar11 = (ushort *)source;
  if (dest + (long)originalSize + -8 < pbVar14) goto LAB_00115970;
  do {
    *(undefined8 *)pbVar15 = *(undefined8 *)puVar11;
    pbVar15 = pbVar15 + 8;
    puVar11 = puVar11 + 4;
  } while (pbVar15 < pbVar14);
  puVar11 = (ushort *)((long)source + uVar19);
  uVar22 = (ulong)*puVar11;
  pbVar16 = pbVar14 + -uVar22;
  uVar21 = (ulong)(uVar20 & 0xf);
LAB_00115826:
  uVar20 = (uint)uVar22;
  source = (char *)(puVar11 + 1);
  if ((int)uVar21 == 0xf) {
    uVar8 = 0;
    do {
      uVar7 = *(ushort *)source;
      source = (char *)((long)source + 1);
      uVar8 = uVar8 + (byte)uVar7;
    } while ((byte)uVar7 == 0xff);
    uVar21 = (ulong)uVar8 + 0xf;
  }
  uVar21 = uVar21 + 4;
  goto LAB_0011584c;
LAB_00115970:
  if (pbVar14 == pbVar1) {
    memmove(pbVar15,source,uVar19);
    source = (char *)(ulong)(uint)(((int)source + (int)uVar19) - iVar4);
    goto LAB_00115991;
  }
LAB_00115737:
  source = (char *)(ulong)(~(uint)source + iVar4);
LAB_00115991:
  return (int)source;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, 0, originalSize,
                                  endOnOutputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}